

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# craigtracer.cpp
# Opt level: O0

void __thiscall
CaDiCraig::CraigTracer::conclude_unsat
          (CraigTracer *this,ConclusionType conclusion,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *proof_chain)

{
  bool bVar1;
  uint8_t uVar2;
  const_reference pvVar3;
  vector<CaDiCraig::CraigData_*,_std::allocator<CaDiCraig::CraigData_*>_> *this_00;
  size_type sVar4;
  CraigTracer *this_01;
  reference piVar5;
  CraigData *in_RDX;
  int in_ESI;
  long in_RDI;
  CraigClauseType in_stack_00000047;
  vector<int,_std::allocator<int>_> *in_stack_00000048;
  CraigTracer *in_stack_00000050;
  int *l_1;
  iterator __end5;
  iterator __begin5;
  value_type *__range5;
  int i;
  int *l;
  iterator __end4;
  iterator __begin4;
  vector<int,_std::allocator<int>_> *__range4;
  CraigData *interpolant;
  CraigData *in_stack_ffffffffffffff28;
  CraigData *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff3c;
  CraigTracer *in_stack_ffffffffffffff40;
  CraigTracer *in_stack_ffffffffffffff50;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_68;
  reference local_60;
  int local_54;
  reference local_50;
  int *local_48;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  long local_38;
  CraigData *in_stack_ffffffffffffffd8;
  CraigData *pCVar6;
  CraigData *pCVar7;
  undefined4 in_stack_fffffffffffffff0;
  
  if (*(long *)(in_RDI + 0x178) != 0) {
    if (*(void **)(in_RDI + 0x178) != (void *)0x0) {
      ::operator_delete(*(void **)(in_RDI + 0x178),0x20);
    }
    *(undefined8 *)(in_RDI + 0x178) = 0;
  }
  pCVar6 = (CraigData *)0x0;
  if (in_ESI == 1) {
    pCVar6 = (CraigData *)::operator_new(0x20);
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDX,0);
    std::vector<CaDiCraig::CraigData_*,_std::allocator<CaDiCraig::CraigData_*>_>::operator[]
              ((vector<CaDiCraig::CraigData_*,_std::allocator<CaDiCraig::CraigData_*>_> *)
               (in_RDI + 0x150),*pvVar3 - 1);
    CraigData::CraigData(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  else if (in_ESI == 2) {
    pCVar6 = (CraigData *)::operator_new(0x20);
    this_00 = (vector<CaDiCraig::CraigData_*,_std::allocator<CaDiCraig::CraigData_*>_> *)
              (in_RDI + 0x150);
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDX,0);
    std::vector<CaDiCraig::CraigData_*,_std::allocator<CaDiCraig::CraigData_*>_>::operator[]
              (this_00,*pvVar3 - 1);
    CraigData::CraigData(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  else if (in_ESI == 4) {
    local_38 = in_RDI + 0x38;
    local_40._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff28);
    local_48 = (int *)std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff28);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_ffffffffffffff30,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_ffffffffffffff28), bVar1) {
      local_50 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_40);
      mark_literal(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_40);
    }
    pCVar6 = create_interpolant_for_clause(in_stack_00000050,in_stack_00000048,in_stack_00000047);
    sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDX);
    local_54 = (int)sVar4;
    while (local_54 = local_54 + -1, -1 < local_54) {
      this_01 = (CraigTracer *)(in_RDI + 0x138);
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDX,
                          (long)local_54);
      local_60 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)this_01,*pvVar3 - 1);
      local_68._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff28);
      std::vector<int,_std::allocator<int>_>::end
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff28);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )in_stack_ffffffffffffff30,
                                (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )in_stack_ffffffffffffff28), bVar1) {
        piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_68);
        uVar2 = mark_literal(this_01,in_stack_ffffffffffffff3c);
        if (uVar2 != '\0') {
          in_stack_ffffffffffffff3c = -*piVar5;
          in_stack_ffffffffffffff28 = (CraigData *)(in_RDI + 0x150);
          pCVar7 = pCVar6;
          pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDX,
                              (long)local_54);
          std::vector<CaDiCraig::CraigData_*,_std::allocator<CaDiCraig::CraigData_*>_>::operator[]
                    ((vector<CaDiCraig::CraigData_*,_std::allocator<CaDiCraig::CraigData_*>_> *)
                     in_stack_ffffffffffffff28,*pvVar3 - 1);
          extend_interpolant_with_resolution
                    ((CraigTracer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,
                     (int)((ulong)pCVar7 >> 0x20),in_stack_ffffffffffffffd8);
          in_stack_ffffffffffffff30 = pCVar6;
          pCVar6 = pCVar7;
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&local_68);
      }
    }
    unmark_all(in_stack_ffffffffffffff50);
  }
  *(CraigData **)(in_RDI + 0x178) = pCVar6;
  return;
}

Assistant:

void CraigTracer::conclude_unsat (
    CaDiCaL::ConclusionType conclusion,
    const std::vector<uint64_t> &proof_chain) {
  if (craig_interpolant) {
    delete craig_interpolant;
    craig_interpolant = 0;
  }

  CraigData *interpolant = 0;
  if (conclusion == CaDiCaL::ConclusionType::CONFLICT) {
    // There is a single global conflict.
    // The proof_chain contains a single empty clause.
    // chain = (c1), c1 = {}
    assert (proof_chain.size () == 1);
    assert (craig_clauses[proof_chain[0] - 1].empty ());
    interpolant = new CraigData (*craig_interpolants[proof_chain[0] - 1]);
  } else if (conclusion == CaDiCaL::ConclusionType::ASSUMPTIONS) {
    // One or more constraints are responsible for the conflict.
    // The proof_chain contains a single clause with failing assumptions.
    // The interpolant of that clause already has been resolved with
    // assumption interpolants. chain = (c1), c1 = { -a1, -a2, -a3, ... }
    assert (proof_chain.size () == 1);
    assert (craig_clauses[proof_chain[0] - 1].size () > 0);
    interpolant = new CraigData (*craig_interpolants[proof_chain[0] - 1]);
  } else if (conclusion == CaDiCaL::ConclusionType::CONSTRAINT) {
    // The constraint clause is responsible for the conflict.

    // Mark literals of conflicting clause.
    for (auto &l : constraint)
      mark_literal (l);

    // Find pivot literal of each clause that was resolved with
    // and extend Craig interpolant for it.
    interpolant =
        create_interpolant_for_clause (constraint, craig_constraint_label);
    for (int i = proof_chain.size () - 1; i >= 0; i--) {
      for (auto &l : craig_clauses[proof_chain[i] - 1]) {
        // Function mark_literal returns true if inverse literal was marked
        // before and marks literal l for the following resolvent literal
        // checks.
        if (!mark_literal (l))
          continue;

        extend_interpolant_with_resolution (
            *interpolant, -l, *craig_interpolants[proof_chain[i] - 1]);
      }
    }

    unmark_all ();
  } else {
    assert (false); // No conclusion given!
  }

  craig_interpolant = interpolant;
}